

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_uint32_iterator_t * roaring_iterator_create(roaring_bitmap_t *r)

{
  roaring_uint32_iterator_t *newit;
  
  newit = (roaring_uint32_iterator_t *)roaring_malloc(0x28);
  if (newit != (roaring_uint32_iterator_t *)0x0) {
    roaring_iterator_init(r,newit);
  }
  return newit;
}

Assistant:

roaring_uint32_iterator_t *roaring_iterator_create(const roaring_bitmap_t *r) {
    roaring_uint32_iterator_t *newit =
        (roaring_uint32_iterator_t *)roaring_malloc(
            sizeof(roaring_uint32_iterator_t));
    if (newit == NULL) return NULL;
    roaring_iterator_init(r, newit);
    return newit;
}